

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

void jpeg_make_d_derived_tbl(j_decompress_ptr cinfo,boolean isDC,int tblno,d_derived_tbl **pdtbl)

{
  jpeg_error_mgr *pjVar1;
  JHUFF_TBL *pJVar2;
  d_derived_tbl *pdVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  char huffsize [257];
  uint huffcode [257];
  char local_548 [268];
  uint auStack_43c [259];
  
  if (3 < (uint)tblno) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x34;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  pJVar2 = cinfo->dc_huff_tbl_ptrs[(ulong)(isDC == 0) * 4 + (long)tblno];
  if (pJVar2 == (JHUFF_TBL *)0x0) {
    pjVar1 = cinfo->err;
    pjVar1->msg_code = 0x34;
    (pjVar1->msg_parm).i[0] = tblno;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (*pdtbl == (d_derived_tbl *)0x0) {
    pdVar3 = (d_derived_tbl *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x620);
    *pdtbl = pdVar3;
  }
  pdVar3 = *pdtbl;
  pdVar3->pub = pJVar2;
  uVar9 = 0;
  lVar11 = 1;
  do {
    bVar4 = pJVar2->bits[lVar11];
    if (0x100 < (int)(uVar9 + bVar4)) {
      pjVar1 = cinfo->err;
      pjVar1->msg_code = 9;
      (*pjVar1->error_exit)((j_common_ptr)cinfo);
    }
    if (bVar4 != 0) {
      memset(local_548 + (int)uVar9,(int)lVar11,(ulong)bVar4);
      uVar9 = uVar9 + bVar4;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x11);
  local_548[(int)uVar9] = '\0';
  iVar10 = (int)local_548[0];
  if (local_548[0] != '\0') {
    iVar7 = 0;
    uVar6 = 0;
    do {
      lVar11 = (long)iVar7;
      if (iVar10 == local_548[lVar11]) {
        lVar5 = 0;
        do {
          auStack_43c[lVar11 + lVar5 + 1] = uVar6 + (int)lVar5;
          lVar8 = lVar5 + lVar11;
          lVar5 = lVar5 + 1;
        } while (iVar10 == local_548[lVar8 + 1]);
        iVar7 = iVar7 + (int)lVar5;
        uVar6 = uVar6 + (int)lVar5;
      }
      if (1L << ((byte)iVar10 & 0x3f) <= (long)(ulong)uVar6) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 9;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
      uVar6 = uVar6 * 2;
      iVar10 = iVar10 + 1;
    } while (local_548[iVar7] != '\0');
  }
  lVar11 = 0;
  lVar5 = 0;
  do {
    if (pJVar2->bits[lVar11 + 1] == '\0') {
      uVar12 = 0xffffffffffffffff;
    }
    else {
      lVar5 = (long)(int)lVar5;
      pdVar3->valoffset[lVar11 + 1] = lVar5 - (ulong)auStack_43c[lVar5 + 1];
      lVar5 = (ulong)pJVar2->bits[lVar11 + 1] + lVar5;
      uVar12 = (ulong)auStack_43c[lVar5];
    }
    pdVar3->maxcode[lVar11 + 1] = uVar12;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x10);
  pdVar3->maxcode[0x11] = 0xfffff;
  lVar5 = 0;
  memset(pdVar3->look_nbits,0,0x400);
  lVar11 = 1;
  do {
    if (pJVar2->bits[lVar11] != '\0') {
      bVar4 = 8 - (char)lVar11;
      lVar5 = (long)(int)lVar5;
      uVar6 = 1;
      do {
        lVar8 = (long)(int)(auStack_43c[lVar5 + 1] << (bVar4 & 0x1f));
        iVar10 = (1 << (bVar4 & 0x1f)) + 1;
        do {
          pdVar3->look_nbits[lVar8] = (int)lVar11;
          pdVar3->look_sym[lVar8] = pJVar2->huffval[lVar5];
          lVar8 = lVar8 + 1;
          iVar10 = iVar10 + -1;
        } while (1 < iVar10);
        lVar5 = lVar5 + 1;
        bVar13 = uVar6 < pJVar2->bits[lVar11];
        uVar6 = uVar6 + 1;
      } while (bVar13);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 9);
  if ((isDC != 0) && (0 < (int)uVar9)) {
    uVar12 = 0;
    do {
      if (0xf < pJVar2->huffval[uVar12]) {
        pjVar1 = cinfo->err;
        pjVar1->msg_code = 9;
        (*pjVar1->error_exit)((j_common_ptr)cinfo);
      }
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  return;
}

Assistant:

LOCAL(void)
jpeg_make_d_derived_tbl (j_decompress_ptr cinfo, boolean isDC, int tblno,
			 d_derived_tbl ** pdtbl)
{
  JHUFF_TBL *htbl;
  d_derived_tbl *dtbl;
  int p, i, l, si, numsymbols;
  int lookbits, ctr;
  char huffsize[257];
  unsigned int huffcode[257];
  unsigned int code;

  /* Note that huffsize[] and huffcode[] are filled in code-length order,
   * paralleling the order of the symbols themselves in htbl->huffval[].
   */

  /* Find the input Huffman table */
  if (tblno < 0 || tblno >= NUM_HUFF_TBLS)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);
  htbl =
    isDC ? cinfo->dc_huff_tbl_ptrs[tblno] : cinfo->ac_huff_tbl_ptrs[tblno];
  if (htbl == NULL)
    ERREXIT1(cinfo, JERR_NO_HUFF_TABLE, tblno);

  /* Allocate a workspace if we haven't already done so. */
  if (*pdtbl == NULL)
    *pdtbl = (d_derived_tbl *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  SIZEOF(d_derived_tbl));
  dtbl = *pdtbl;
  dtbl->pub = htbl;		/* fill in back link */
  
  /* Figure C.1: make table of Huffman code length for each symbol */

  p = 0;
  for (l = 1; l <= 16; l++) {
    i = (int) htbl->bits[l];
    if (i < 0 || p + i > 256)	/* protect against table overrun */
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    while (i--)
      huffsize[p++] = (char) l;
  }
  huffsize[p] = 0;
  numsymbols = p;
  
  /* Figure C.2: generate the codes themselves */
  /* We also validate that the counts represent a legal Huffman code tree. */
  
  code = 0;
  si = huffsize[0];
  p = 0;
  while (huffsize[p]) {
    while (((int) huffsize[p]) == si) {
      huffcode[p++] = code;
      code++;
    }
    /* code is now 1 more than the last code used for codelength si; but
     * it must still fit in si bits, since no code is allowed to be all ones.
     */
    if (((INT32) code) >= (((INT32) 1) << si))
      ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    code <<= 1;
    si++;
  }

  /* Figure F.15: generate decoding tables for bit-sequential decoding */

  p = 0;
  for (l = 1; l <= 16; l++) {
    if (htbl->bits[l]) {
      /* valoffset[l] = huffval[] index of 1st symbol of code length l,
       * minus the minimum code of length l
       */
      dtbl->valoffset[l] = (INT32) p - (INT32) huffcode[p];
      p += htbl->bits[l];
      dtbl->maxcode[l] = huffcode[p-1]; /* maximum code of length l */
    } else {
      dtbl->maxcode[l] = -1;	/* -1 if no codes of this length */
    }
  }
  dtbl->maxcode[17] = 0xFFFFFL; /* ensures jpeg_huff_decode terminates */

  /* Compute lookahead tables to speed up decoding.
   * First we set all the table entries to 0, indicating "too long";
   * then we iterate through the Huffman codes that are short enough and
   * fill in all the entries that correspond to bit sequences starting
   * with that code.
   */

  MEMZERO(dtbl->look_nbits, SIZEOF(dtbl->look_nbits));

  p = 0;
  for (l = 1; l <= HUFF_LOOKAHEAD; l++) {
    for (i = 1; i <= (int) htbl->bits[l]; i++, p++) {
      /* l = current code's length, p = its index in huffcode[] & huffval[]. */
      /* Generate left-justified code followed by all possible bit sequences */
      lookbits = huffcode[p] << (HUFF_LOOKAHEAD-l);
      for (ctr = 1 << (HUFF_LOOKAHEAD-l); ctr > 0; ctr--) {
	dtbl->look_nbits[lookbits] = l;
	dtbl->look_sym[lookbits] = htbl->huffval[p];
	lookbits++;
      }
    }
  }

  /* Validate symbols as being reasonable.
   * For AC tables, we make no check, but accept all byte values 0..255.
   * For DC tables, we require the symbols to be in range 0..15.
   * (Tighter bounds could be applied depending on the data depth and mode,
   * but this is sufficient to ensure safe decoding.)
   */
  if (isDC) {
    for (i = 0; i < numsymbols; i++) {
      int sym = htbl->huffval[i];
      if (sym < 0 || sym > 15)
	ERREXIT(cinfo, JERR_BAD_HUFF_TABLE);
    }
  }
}